

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O1

void __thiscall wabt::Module::AppendFields(Module *this,ModuleFieldList *fields)

{
  ModuleField *pMVar1;
  size_t sVar2;
  __uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_20;
  
  sVar2 = fields->size_;
  if (sVar2 != 0) {
    do {
      local_20._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
      super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)fields->first_;
      if (local_20._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl ==
          (tuple<wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)fields->last_) {
        fields->first_ = (ModuleField *)0x0;
        fields->last_ = (ModuleField *)0x0;
      }
      else {
        pMVar1 = (((ModuleField *)
                  local_20._M_t.
                  super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                  .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->
                 super_intrusive_list_base<wabt::ModuleField>).next_;
        fields->first_ = pMVar1;
        (pMVar1->super_intrusive_list_base<wabt::ModuleField>).prev_ = (ModuleField *)0x0;
      }
      (((ModuleField *)
       local_20._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
       super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->
      super_intrusive_list_base<wabt::ModuleField>).next_ = (ModuleField *)0x0;
      (((ModuleField *)
       local_20._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
       super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->
      super_intrusive_list_base<wabt::ModuleField>).prev_ = (ModuleField *)0x0;
      fields->size_ = sVar2 - 1;
      AppendField(this,(unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)
                       &local_20);
      if ((_Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)
          local_20._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl != (ModuleField *)0x0) {
        (**(code **)(*(long *)local_20._M_t.
                              super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                              .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl + 8))
                  ();
      }
      sVar2 = fields->size_;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

inline bool intrusive_list<T>::empty() const noexcept {
  return size_ == 0;
}